

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O1

Fxu_Var * Fxu_MatrixAddVar(Fxu_Matrix *p)

{
  int iVar1;
  Fxu_Var *pLink;
  
  pLink = (Fxu_Var *)Fxu_MemFetch(p,0x48);
  pLink->iVar = 0;
  pLink->nCubes = 0;
  pLink->pFirst = (Fxu_Cube *)0x0;
  pLink->ppPairs = (Fxu_Pair ***)0x0;
  (pLink->lLits).pHead = (Fxu_Lit *)0x0;
  (pLink->lLits).pTail = (Fxu_Lit *)0x0;
  *(undefined8 *)&(pLink->lLits).nItems = 0;
  pLink->pPrev = (Fxu_Var *)0x0;
  pLink->pNext = (Fxu_Var *)0x0;
  pLink->pOrder = (Fxu_Var *)0x0;
  iVar1 = (p->lVars).nItems;
  pLink->iVar = iVar1;
  p->ppVars[iVar1] = pLink;
  Fxu_ListMatrixAddVariable(p,pLink);
  return pLink;
}

Assistant:

Fxu_Var * Fxu_MatrixAddVar( Fxu_Matrix * p )
{
    Fxu_Var * pVar;
    pVar = MEM_ALLOC_FXU( p, Fxu_Var, 1 );
    memset( pVar, 0, sizeof(Fxu_Var) );
    pVar->iVar = p->lVars.nItems;
    p->ppVars[pVar->iVar] = pVar;
    Fxu_ListMatrixAddVariable( p, pVar );
    return pVar;
}